

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O3

LispPTR bitblt_bitmap(LispPTR *args)

{
  ushort uVar1;
  bool bVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  uint uVar5;
  DLword *pDVar6;
  int w;
  int h;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int y;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  DLword *pDVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint local_c0;
  DLword *local_60;
  
  uVar5 = *args;
  if ((uVar5 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  pDVar23 = Lisp_world;
  uVar16 = args[3];
  if ((uVar16 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar16);
  }
  pDVar6 = Lisp_world;
  if (((Lisp_world[(ulong)uVar16 + 4] == 1) && (pDVar23 = pDVar23 + uVar5, pDVar23[4] == 1)) &&
     (args[8] != (uint)MERGE_atom)) {
    uVar5 = args[1];
    if ((uVar5 & 0xfff0000) == 0xf0000) {
      uVar5 = uVar5 | 0xffff0000;
    }
    else if ((uVar5 & 0xfff0000) == 0xe0000) {
      uVar5 = uVar5 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar5 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar5 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
      }
      uVar5 = *(uint *)(Lisp_world + uVar5);
    }
    uVar22 = args[2];
    if ((uVar22 & 0xfff0000) == 0xf0000) {
      uVar22 = uVar22 | 0xffff0000;
    }
    else if ((uVar22 & 0xfff0000) == 0xe0000) {
      uVar22 = uVar22 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar22 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar22 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar22);
      }
      uVar22 = *(uint *)(Lisp_world + uVar22);
    }
    uVar17 = args[4];
    uVar8 = (ulong)uVar17;
    if ((uVar17 & 0xfff0000) == 0xf0000) {
      uVar17 = uVar17 | 0xffff0000;
    }
    else if ((uVar17 & 0xfff0000) == 0xe0000) {
      uVar17 = uVar17 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar17 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar17 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
      }
      uVar17 = *(uint *)(Lisp_world + uVar8);
    }
    uVar14 = args[5];
    if ((uVar14 & 0xfff0000) == 0xf0000) {
      uVar14 = uVar14 | 0xffff0000;
    }
    else if ((uVar14 & 0xfff0000) == 0xe0000) {
      uVar14 = uVar14 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar14 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar14 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar14);
      }
      uVar14 = *(uint *)(Lisp_world + uVar14);
    }
    uVar9 = args[6];
    if ((uVar9 & 0xfff0000) == 0xf0000) {
      uVar9 = uVar9 | 0xffff0000;
    }
    else if ((uVar9 & 0xfff0000) == 0xe0000) {
      uVar9 = uVar9 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar9 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar9 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar9 = *(uint *)(Lisp_world + uVar9);
    }
    uVar12 = args[7];
    if ((uVar12 & 0xfff0000) == 0xf0000) {
      uVar12 = uVar12 | 0xffff0000;
    }
    else if ((uVar12 & 0xfff0000) == 0xe0000) {
      uVar12 = uVar12 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar12 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar12 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar12);
      }
      uVar12 = *(uint *)(Lisp_world + uVar12);
    }
    uVar13 = args[9];
    LVar4 = args[0xb];
    uVar7 = args[0xc];
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      uVar7 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      uVar7 = uVar7 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar7 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar7 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
      }
      uVar7 = *(uint *)(Lisp_world + uVar7);
    }
    uVar19 = args[0xd];
    if ((uVar19 & 0xfff0000) == 0xf0000) {
      uVar19 = uVar19 | 0xffff0000;
    }
    else if ((uVar19 & 0xfff0000) == 0xe0000) {
      uVar19 = uVar19 & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar19 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      if ((uVar19 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar19);
      }
      uVar19 = *(uint *)(Lisp_world + uVar19);
    }
    pDVar6 = pDVar6 + uVar16;
    uVar16 = (uint)pDVar6[2];
    uVar1 = pDVar6[5];
    if (LVar4 == 0) {
      uVar24 = (uint)uVar1;
      uVar11 = 0;
      uVar20 = 0;
    }
    else {
      LVar3 = car(LVar4);
      if ((LVar3 & 0xfff0000) == 0xf0000) {
        uVar21 = LVar3 | 0xffff0000;
      }
      else if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar21 = LVar3 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
        }
        uVar21 = *(uint *)(Lisp_world + LVar3);
      }
      uVar11 = 0;
      if (0 < (int)uVar21) {
        uVar11 = uVar21;
      }
      LVar4 = cdr(LVar4);
      LVar3 = car(LVar4);
      if ((LVar3 & 0xfff0000) == 0xf0000) {
        uVar25 = LVar3 | 0xffff0000;
      }
      else if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar25 = LVar3 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
        }
        uVar25 = *(uint *)(Lisp_world + LVar3);
      }
      uVar20 = 0;
      if (0 < (int)uVar25) {
        uVar20 = uVar25;
      }
      LVar4 = cdr(LVar4);
      LVar3 = car(LVar4);
      if ((LVar3 & 0xfff0000) == 0xf0000) {
        uVar26 = LVar3 | 0xffff0000;
      }
      else if ((LVar3 & 0xfff0000) == 0xe0000) {
        uVar26 = LVar3 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        if ((LVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
        }
        uVar26 = *(uint *)(Lisp_world + LVar3);
      }
      uVar24 = uVar26 + uVar21;
      if ((int)(uint)uVar1 <= (int)(uVar26 + uVar21)) {
        uVar24 = (uint)uVar1;
      }
      LVar4 = cdr(LVar4);
      LVar4 = car(LVar4);
      if ((LVar4 & 0xfff0000) == 0xf0000) {
        uVar21 = LVar4 | 0xffff0000;
      }
      else if ((LVar4 & 0xfff0000) == 0xe0000) {
        uVar21 = LVar4 & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(LVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          return 0;
        }
        if ((LVar4 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar4);
        }
        uVar21 = *(uint *)(Lisp_world + LVar4);
      }
      if ((int)(uVar21 + uVar25) < (int)uVar16) {
        uVar16 = uVar21 + uVar25;
      }
    }
    if ((int)uVar11 <= (int)uVar17) {
      uVar11 = uVar17;
    }
    uVar21 = uVar9 + uVar17;
    if ((int)uVar24 < (int)(uVar9 + uVar17)) {
      uVar21 = uVar24;
    }
    if ((int)uVar20 <= (int)uVar14) {
      uVar20 = uVar14;
    }
    uVar24 = uVar12 + uVar14;
    if ((int)uVar16 < (int)(uVar12 + uVar14)) {
      uVar24 = uVar16;
    }
    iVar15 = uVar14 - uVar22;
    iVar18 = uVar17 - uVar5;
    uVar5 = uVar11 - iVar18;
    if ((int)(uVar11 - iVar18) <= (int)uVar7) {
      uVar5 = uVar7;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar16 = uVar20 - iVar15;
    if ((int)(uVar20 - iVar15) <= (int)uVar19) {
      uVar16 = uVar19;
    }
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    uVar22 = uVar7 + uVar9;
    if ((int)(uVar21 - iVar18) < (int)(uVar7 + uVar9)) {
      uVar22 = uVar21 - iVar18;
    }
    if ((int)(uint)pDVar23[5] <= (int)uVar22) {
      uVar22 = (uint)pDVar23[5];
    }
    uVar17 = uVar19 + uVar12;
    if ((int)(uVar24 - iVar15) < (int)(uVar19 + uVar12)) {
      uVar17 = uVar24 - iVar15;
    }
    uVar14 = (uint)pDVar23[2];
    if ((int)(uint)pDVar23[2] <= (int)uVar17) {
      uVar17 = uVar14;
    }
    w = uVar22 - uVar5;
    if (w == 0 || (int)uVar22 < (int)uVar5) {
      return 0;
    }
    h = uVar17 - uVar16;
    if (h == 0 || (int)uVar17 < (int)uVar16) {
      return 0;
    }
    y = (uint)pDVar6[2] - (iVar15 + uVar17);
    iVar15 = uVar14 - uVar17;
    uVar17 = 1;
    if (uVar13 != ERASE_atom) {
      uVar17 = (uint)(uVar13 == INVERT_atom) * 3;
    }
    uVar9 = 2;
    if (uVar13 != PAINT_atom) {
      uVar9 = uVar17;
    }
    uVar17 = uVar5 + iVar18;
    if ((((pDVar23 == pDVar6) && (iVar15 <= y)) && (y <= (int)(uVar14 - uVar16))) &&
       ((iVar15 != y || ((0 < iVar18 && ((int)uVar17 < (int)uVar22)))))) {
      local_60 = Lisp_world + ((h + y + -1) * (uint)pDVar6[3] + *(int *)pDVar6);
      uVar5 = (iVar18 + uVar22) - 1;
      if ((int)(iVar18 + uVar22) < 1) {
        uVar8 = -(ulong)(8 - (iVar18 + uVar22) >> 3);
      }
      else {
        uVar8 = (ulong)(uVar5 >> 3);
      }
      uVar8 = uVar8 + (long)local_60;
      uVar13 = (uVar5 & 7) + ((uint)uVar8 & 3) * 8;
      iVar15 = uVar13 - w;
      uVar12 = iVar15 + 1U & 0x1f;
      uVar7 = (-(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU))) &
              -1 << (~(byte)uVar13 & 0x1f);
      uVar5 = (uVar13 ^ 0xffffffff) + w;
      bVar2 = false;
      uVar19 = uVar5 >> 5;
      if ((int)uVar5 < 1) {
        uVar19 = 0;
      }
      uVar27 = (long)Lisp_world +
               (ulong)(uVar22 - 1 >> 3) +
               (ulong)(((uVar14 - uVar16) + -1) * (uint)pDVar23[3] + *(int *)pDVar23) * 2;
      local_c0 = (uVar22 - 1 & 7) + ((uint)uVar27 & 3) * 8;
      iVar18 = local_c0 - w;
      uVar16 = iVar15 - iVar18;
      uVar5 = iVar18 + 1U & 0x1f;
      uVar22 = ~(-1 << ((char)iVar18 - (char)iVar15 & 0x1fU));
    }
    else {
      local_60 = Lisp_world + ((uint)pDVar6[3] * y + *(int *)pDVar6);
      if ((int)uVar17 < 0) {
        uVar8 = -(ulong)(7 - uVar17 >> 3);
      }
      else {
        uVar8 = (ulong)(uVar17 >> 3);
      }
      uVar8 = uVar8 + (long)local_60;
      uVar12 = (uVar17 & 7) + ((uint)uVar8 & 3) * 8;
      uVar13 = (w + uVar12) - 1 & 0x1f;
      uVar7 = -1 << (~(byte)uVar13 & 0x1f) &
              (-(uint)(uVar12 == 0) | -1 << (-(char)uVar12 & 0x1fU) ^ 0xffffffffU);
      uVar19 = ((int)(uVar12 + w) >> 5) - 1;
      uVar27 = (long)Lisp_world +
               (ulong)(uVar5 >> 3) + (ulong)(iVar15 * (uint)pDVar23[3] + *(int *)pDVar23) * 2;
      uVar5 = (uVar5 & 7) + ((uint)uVar27 & 3) * 8;
      local_c0 = (w + uVar5) - 1 & 0x1f;
      uVar22 = uVar5 - uVar12 & 0x1f;
      uVar16 = uVar12 - uVar5;
      uVar22 = -(uint)(uVar22 == 0) | ~(-1 << (sbyte)uVar22);
      bVar2 = true;
    }
    ScreenLocked = 1;
    if (0 < h) {
      uVar27 = uVar27 & 0xfffffffffffffffc;
      if (bVar2) {
        if ((uVar12 < uVar5) && (0x20 < (int)(w + uVar5))) {
          lVar10 = uVar27 + 8;
        }
        else {
          lVar10 = uVar27 + 4;
        }
        if (0x20 < (int)(uVar12 + w)) {
          LVar4 = (*(code *)(&DAT_00143754 + *(int *)(&DAT_00143754 + (ulong)uVar9 * 4)))
                            (uVar12,lVar10,&DAT_00143754,
                             &DAT_00143754 + *(int *)(&DAT_00143754 + (ulong)uVar9 * 4));
          return LVar4;
        }
      }
      else {
        if (local_c0 < uVar13) {
          if ((int)(uVar12 + 1) < (int)(w + uVar5)) {
            lVar10 = uVar27 - 8;
          }
          else {
            lVar10 = uVar27 - 4;
          }
        }
        else {
          lVar10 = uVar27 - 4;
        }
        if (0x20 < (int)(uVar12 + w)) {
          LVar4 = (*(code *)(&DAT_00143704 + *(int *)(&DAT_00143704 + (ulong)uVar9 * 4)))
                            (uVar12,lVar10,
                             &DAT_00143704 + *(int *)(&DAT_00143704 + (ulong)uVar9 * 4),(ulong)uVar9
                             ,&DAT_00143704,uVar16 & 0x1f,uVar19,uVar5,uVar13,uVar22,h);
          return LVar4;
        }
      }
      LVar4 = (*(code *)(&DAT_001437a4 + *(int *)(&DAT_001437a4 + (ulong)uVar9 * 4)))
                        (uVar12,~uVar7 & *(uint *)(uVar8 & 0xfffffffffffffffc));
      return LVar4;
    }
    if ((DisplayRegion68k <= local_60) && (local_60 <= DISP_MAX_Address)) {
      flush_display_region(uVar17,y,w,h);
    }
    ScreenLocked = 0;
  }
  else {
    if ((BITBLTBITMAP_index == 0xffffffff) &&
       (BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0),
       BITBLTBITMAP_index == 0xffffffff)) {
      error("BITBLTBITMAP install failed");
      return 0;
    }
    MachineState.csp = MachineState.csp + 0x1a;
    ccfuncall(BITBLTBITMAP_index,0xe,3);
  }
  return 0x4c;
}

Assistant:

LispPTR bitblt_bitmap(LispPTR *args) {
  BITMAP *SourceBitmap, *DestBitmap;
  int sleft, sbottom, dleft, dbottom, width, height, clipleft, clipbottom;
  LispPTR clipreg;
  int stodx, stody, right, top, destbits, sourcebits, left, bottom;
  LispPTR sourcetype, operation, texture;
  DLword *srcbase, *dstbase;
  int dlx, dty, slx, sty, srcbpl, dstbpl, op, src_comp, backwardflg = 0, displayflg = 0;

#ifdef INIT
  init_kbd_startup;
#endif

  /* Get arguments  and check the possibilities of PUNT */
  SourceBitmap = (BITMAP *)NativeAligned4FromLAddr(args[0]);
  DestBitmap = (BITMAP *)NativeAligned4FromLAddr(args[3]);
  /* It does not handle COLOR ..... maybe later */
  destbits = DestBitmap->bmbitperpixel;
  sourcebits = SourceBitmap->bmbitperpixel;
  if ((destbits != 1) || (sourcebits != 1)) {
    PUNT_TO_BITBLTBITMAP;
  }
  sourcetype = args[8];
  /* sourcetype == MERGE_atom case must be handled in Lisp function \\PUNT.BITBLT.BITMAP */
  if (sourcetype == MERGE_atom) { PUNT_TO_BITBLTBITMAP; }

  N_GETNUMBER(args[1], sleft, bad_arg);
  N_GETNUMBER(args[2], sbottom, bad_arg);
  N_GETNUMBER(args[4], dleft, bad_arg);
  N_GETNUMBER(args[5], dbottom, bad_arg);
  N_GETNUMBER(args[6], width, bad_arg);
  N_GETNUMBER(args[7], height, bad_arg);
  operation = args[9];
  texture = args[10];
  clipreg = args[11];
  N_GETNUMBER(args[12], clipleft, bad_arg);
  N_GETNUMBER(args[13], clipbottom, bad_arg);

  left = bottom = 0;
  top = DestBitmap->bmheight;
  right = DestBitmap->bmwidth;

  if (clipreg != NIL_PTR) {
    /* clip the BITBLT using the clipping region supplied */
    LispPTR clipvalue;
    int temp, cr_left, cr_bot;

    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_left, bad_arg);
    left = max(left, cr_left);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, cr_bot, bad_arg);
    bottom = max(bottom, cr_bot);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    right = min(right, cr_left + temp);

    clipreg = cdr(clipreg);
    clipvalue = car(clipreg);
    N_GETNUMBER(clipvalue, temp, bad_arg);
    top = min(top, cr_bot + temp);
  }

  left = max(left, dleft);
  right = min(right, dleft + width);
  bottom = max(bottom, dbottom);
  top = min(top, dbottom + height);
  stody = dbottom - sbottom;
  stodx = dleft - sleft;

  {
    int temp;
    left = max(clipleft, max(0, left - stodx));
    bottom = max(clipbottom, max(0, bottom - stody));
    temp = SourceBitmap->bmwidth;
    right = min(temp, min(right - stodx, clipleft + width));
    temp = SourceBitmap->bmheight;
    top = min(temp, min(top - stody, clipbottom + height));
  }

  if ((right <= left) || (top <= bottom)) return (NIL);

  /*** PUT SOURCETYPE MERGE special code HERE ***/
  /**** See above, earlier in this code check sourcetype and punting. *****/
  /**** sourcebits CANNOT be unequal to destbits from earlier check */

  if (sourcebits != destbits) {
    /* DBPRINT(("BITBLT between bitmaps of different sizes, unimplemented.")); */
      return NIL;
  }
  /* if not 1-bit-per-pixel adjust limits by pixel size */
  switch (sourcebits) {
  case 1:
      break;
  case 4:
      left = left * 4;
      right = right * 4;
      stodx = stodx * 4;
      /* Put color texture merge case here */
      break;

  case 8:
      left = left * 8;
      right = right * 8;
      stodx = stodx * 8;
      /* Put color texture merge case here */
      break;

  case 24:
      left = left * 24;
      right = right * 24;
      stodx = stodx * 24;
      /* Put color texture merge case here */
      break;
  }

  height = top - bottom;
  width = right - left;
  dty = DestBitmap->bmheight - (top + stody);
  dlx = left + stodx;
  sty = SourceBitmap->bmheight - top;
  slx = left;

  /*** Stolen from bitbltsub, to avoid the call overhead: ***/
  src_comp = bbsrc_type(sourcetype, operation);
  op = bbop(sourcetype, operation);

  dstbpl = DestBitmap->bmrasterwidth << 4;

  /* Sourcetype guaranteed not to be TEXTURE by BITBLT fn */
  srcbpl = SourceBitmap->bmrasterwidth << 4;

  /* compute flags */
  if (SourceBitmap != DestBitmap)
    ;
  else if (sty > dty)
    ;
  else if (dty > (sty + height))
    ;
  else if ((sty != dty) || ((slx < dlx) && (dlx < (slx + width))))
    backwardflg = T;

  if (backwardflg) {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * (sty + height - 1)));
    dstbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * (dty + height - 1)));
    srcbpl = 0 - srcbpl;
    dstbpl = 0 - dstbpl;
  } else {
    srcbase = (DLword *)NativeAligned2FromLAddr(
        ADDBASE(SourceBitmap->bmbase, SourceBitmap->bmrasterwidth * sty));
    dstbase =
        (DLword *)NativeAligned2FromLAddr(ADDBASE(DestBitmap->bmbase, DestBitmap->bmrasterwidth * dty));
  }

  displayflg = n_new_cursorin(srcbase, slx, sty, width, height);

do_it_now:
  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dlx, dty, width, height);
  if (displayflg) HideCursor;
#endif /*  REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, slx, dlx, width, height, srcbpl, dstbpl, backwardflg, src_comp, op, 0, 0,
         0);
#else
#define gray 0
#define dx dlx
#define sx slx
#define w width
#define h height
#define curr_gray_line dx
#define num_gray 0
  new_bitblt_code;
#undef gray
#undef dx
#undef sx
#undef w
#undef h
#undef curr_gray_line
#undef num_gray
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dlx, dty, width,height));*/
      flush_display_region(dlx, dty, width, height);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dlx, dty, width, height);
#endif /* SDL */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dlx, dty, width, height);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

  return (ATOM_T);

bad_arg:
  return (NIL);
}